

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool __thiscall
ON_OBSOLETE_V5_DimOrdinate::GetTightBoundingBox
          (ON_OBSOLETE_V5_DimOrdinate *this,ON_BoundingBox *tight_bbox,bool bGrowBox,ON_Xform *xform
          )

{
  double dVar1;
  bool bVar2;
  int iVar3;
  ON_2dPoint *pOVar4;
  ON_3dPoint local_80;
  ON_3dPoint local_58;
  undefined1 local_40 [8];
  ON_3dPointArray P;
  ON_Xform *xform_local;
  bool bGrowBox_local;
  ON_BoundingBox *tight_bbox_local;
  ON_OBSOLETE_V5_DimOrdinate *this_local;
  
  P.super_ON_SimpleArray<ON_3dPoint>._16_8_ = xform;
  iVar3 = ON_SimpleArray<ON_2dPoint>::Count
                    (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                      super_ON_SimpleArray<ON_2dPoint>);
  xform_local._7_1_ = bGrowBox;
  if (iVar3 == 2) {
    ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)local_40,2);
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,0);
    dVar1 = pOVar4->x;
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,0);
    ON_Plane::PointAt(&local_58,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane,dVar1,pOVar4->y);
    ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_40,&local_58);
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,1);
    dVar1 = pOVar4->x;
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,1);
    ON_Plane::PointAt(&local_80,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane,dVar1,pOVar4->y);
    ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_40,&local_80);
    bVar2 = ON_3dPointArray::GetTightBoundingBox
                      ((ON_3dPointArray *)local_40,tight_bbox,bGrowBox,
                       (ON_Xform *)P.super_ON_SimpleArray<ON_3dPoint>._16_8_);
    if (bVar2) {
      xform_local._7_1_ = 1;
    }
    ON_3dPointArray::~ON_3dPointArray((ON_3dPointArray *)local_40);
  }
  else if ((bGrowBox) && (bVar2 = ON_BoundingBox::IsValid(tight_bbox), !bVar2)) {
    ON_BoundingBox::Destroy(tight_bbox);
    xform_local._7_1_ = 0;
  }
  return (xform_local._7_1_ & 1) != 0;
}

Assistant:

bool ON_OBSOLETE_V5_DimOrdinate::GetTightBoundingBox( ON_BoundingBox& tight_bbox,
                                                 bool bGrowBox,
                                                 const ON_Xform* xform) const
{
  if( m_points.Count() == 2)
  {
    ON_3dPointArray P(2);

    P.Append( m_plane.PointAt( m_points[0].x, m_points[0].y));
    P.Append( m_plane.PointAt( m_points[1].x, m_points[1].y));

    if ( P.GetTightBoundingBox( tight_bbox, bGrowBox, xform))
      bGrowBox = true;
  }
  else if( bGrowBox && !tight_bbox.IsValid())
  {
    tight_bbox.Destroy();
    bGrowBox = false;
  }

  return( 0 != bGrowBox);
}